

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::emit_fixup(CompilerGLSL *this)

{
  bool bVar1;
  char *suffix;
  char *local_10;
  
  bVar1 = Compiler::is_vertex_like_shader(&this->super_Compiler);
  if (bVar1) {
    if ((this->options).vertex.fixup_clipspace == true) {
      local_10 = "";
      if ((this->backend).float_literal_suffix != false) {
        local_10 = "f";
      }
      statement<char_const(&)[20],char_const*&,char_const(&)[34]>
                (this,(char (*) [20])"gl_Position.z = 2.0",&local_10,
                 (char (*) [34])" * gl_Position.z - gl_Position.w;");
    }
    if ((this->options).vertex.flip_vert_y == true) {
      statement<char_const(&)[32]>(this,(char (*) [32])"gl_Position.y = -gl_Position.y;");
    }
  }
  return;
}

Assistant:

void CompilerGLSL::emit_fixup()
{
	if (is_vertex_like_shader())
	{
		if (options.vertex.fixup_clipspace)
		{
			const char *suffix = backend.float_literal_suffix ? "f" : "";
			statement("gl_Position.z = 2.0", suffix, " * gl_Position.z - gl_Position.w;");
		}

		if (options.vertex.flip_vert_y)
			statement("gl_Position.y = -gl_Position.y;");
	}
}